

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error open_face_from_buffer
                   (FT_Library library,FT_Byte *base,FT_ULong size,FT_Long face_index,
                   char *driver_name,FT_Face_conflict *aface)

{
  FT_Memory memory;
  FT_UInt FVar1;
  FT_Stream pFVar2;
  FT_UInt FVar3;
  FT_Open_Args args;
  
  if (base == (FT_Byte *)0x0) {
    FVar3 = 6;
  }
  else {
    memory = library->memory;
    pFVar2 = (FT_Stream)ft_mem_alloc(memory,0x50,(FT_Error *)&args);
    if (args.flags == 0) {
      pFVar2->base = base;
      pFVar2->size = size;
      pFVar2->pos = 0;
      pFVar2->cursor = (uchar *)0x0;
      pFVar2->read = (FT_Stream_IoFunc)0x0;
      pFVar2->close = memory_stream_close;
      args.flags = 2;
      args.stream = pFVar2;
      if (driver_name != (char *)0x0) {
        args.flags = 10;
        args.driver = FT_Get_Module(library,driver_name);
      }
      FVar3 = 0;
      FVar1 = ft_open_face_internal(library,&args,face_index,aface,'\0');
      if (FVar1 == 0) {
        (*aface)->face_flags = (*aface)->face_flags & 0xfffffffffffffbff;
      }
      else {
        if (pFVar2->close != (FT_Stream_CloseFunc)0x0) {
          (*pFVar2->close)(pFVar2);
        }
        (*memory->free)(memory,pFVar2);
        FVar3 = FVar1;
      }
    }
    else {
      (*memory->free)(memory,base);
      FVar3 = args.flags;
    }
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  open_face_from_buffer( FT_Library   library,
                         FT_Byte*     base,
                         FT_ULong     size,
                         FT_Long      face_index,
                         const char*  driver_name,
                         FT_Face     *aface )
  {
    FT_Open_Args  args;
    FT_Error      error;
    FT_Stream     stream = NULL;
    FT_Memory     memory = library->memory;


    error = new_memory_stream( library,
                               base,
                               size,
                               memory_stream_close,
                               &stream );
    if ( error )
    {
      FT_FREE( base );
      return error;
    }

    args.flags  = FT_OPEN_STREAM;
    args.stream = stream;
    if ( driver_name )
    {
      args.flags  = args.flags | FT_OPEN_DRIVER;
      args.driver = FT_Get_Module( library, driver_name );
    }

#ifdef FT_MACINTOSH
    /* At this point, the face index has served its purpose;  */
    /* whoever calls this function has already used it to     */
    /* locate the correct font data.  We should not propagate */
    /* this index to FT_Open_Face() (unless it is negative).  */

    if ( face_index > 0 )
      face_index &= 0x7FFF0000L; /* retain GX data */
#endif

    error = ft_open_face_internal( library, &args, face_index, aface, 0 );

    if ( !error )
      (*aface)->face_flags &= ~FT_FACE_FLAG_EXTERNAL_STREAM;
    else
#ifdef FT_MACINTOSH
      FT_Stream_Free( stream, 0 );
#else
    {
      FT_Stream_Close( stream );
      FT_FREE( stream );
    }
#endif

    return error;
  }